

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dieharder_file.cc
# Opt level: O0

void generate<trng::mrg2>(size_t samples,unsigned_long seed)

{
  parameter_type P;
  int iVar1;
  result_type rVar2;
  ostream *poVar3;
  char *pcVar4;
  ulong in_RSI;
  ulong in_RDI;
  size_t j;
  mrg2 r;
  mrg2 *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  result_type in_stack_ffffffffffffffb4;
  ulong local_30;
  
  P.a[1] = in_stack_ffffffffffffffb4;
  P.a[0] = in_stack_ffffffffffffffb0;
  trng::mrg2::mrg2(in_stack_ffffffffffffffa8,P);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "#==================================================================\n");
  poVar3 = std::operator<<(poVar3,"# generator ");
  pcVar4 = trng::mrg2::name();
  poVar3 = std::operator<<(poVar3,pcVar4);
  poVar3 = std::operator<<(poVar3,"  seed = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RSI);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,
                           "#==================================================================\n");
  poVar3 = std::operator<<(poVar3,"type: d\n");
  poVar3 = std::operator<<(poVar3,"count: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RDI);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"numbit: ");
  trng::mrg2::max();
  trng::mrg2::min();
  iVar1 = trng::int_math::log2_ceil<int>(0);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  std::operator<<(poVar3,'\n');
  for (local_30 = 0; local_30 < in_RDI; local_30 = local_30 + 1) {
    in_stack_ffffffffffffffb4 =
         trng::mrg2::operator()
                   ((mrg2 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    rVar2 = trng::mrg2::min();
    poVar3 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,in_stack_ffffffffffffffb4 - rVar2);
    std::operator<<(poVar3,'\n');
  }
  return;
}

Assistant:

void generate(std::size_t samples, unsigned long seed) {
  R r;
  std::cout << "#==================================================================\n"
            << "# generator " << r.name() << "  seed = " << seed << "\n"
            << "#==================================================================\n"
            << "type: d\n"
            << "count: " << samples << "\n"
            << "numbit: " << trng::int_math::log2_ceil(r.max() - r.min()) << '\n';
  for (std::size_t j{0}; j < samples; ++j)
    std::cout << r() - r.min() << '\n';
}